

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_dispatch_test.cc
# Opt level: O0

void __thiscall
ImplDispatchTest_AEAD_AES_GCM_Test::TestBody(ImplDispatchTest_AEAD_AES_GCM_Test *this)

{
  initializer_list<std::pair<unsigned_long,_bool>_> __l;
  byte local_142;
  byte local_141;
  byte local_131;
  byte local_121;
  byte local_111;
  byte local_102;
  byte local_101;
  byte local_f2;
  anon_class_1_0_00000001 local_f1;
  function<void_()> local_f0;
  allocator<std::pair<unsigned_long,_bool>_> local_bf;
  bool local_be;
  bool local_bd;
  bool local_bc;
  bool local_bb;
  bool local_ba;
  bool local_b9;
  pair<unsigned_long,_bool> local_b8;
  pair<unsigned_long,_bool> pStack_a8;
  pair<unsigned_long,_bool> pStack_98;
  pair<unsigned_long,_bool> pStack_88;
  pair<unsigned_long,_bool> pStack_78;
  pair<unsigned_long,_bool> pStack_68;
  pair<unsigned_long,_bool> pStack_58;
  pair<unsigned_long,_bool> pStack_48;
  iterator local_38;
  size_type local_30;
  vector<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_> local_28;
  ImplDispatchTest_AEAD_AES_GCM_Test *local_10;
  ImplDispatchTest_AEAD_AES_GCM_Test *this_local;
  
  local_f2 = 0;
  if (((this->super_ImplDispatchTest).aesni_ & 1U) != 0) {
    local_101 = 0;
    if (((this->super_ImplDispatchTest).is_x86_64_ & 1U) != 0) {
      local_101 = (this->super_ImplDispatchTest).vaes_;
    }
    local_f2 = local_101 ^ 0xff;
  }
  local_b9 = (bool)(local_f2 & 1);
  local_10 = this;
  std::pair<unsigned_long,_bool>::pair<bool,_true>
            (&local_b8,&kFlag_aes_hw_ctr32_encrypt_blocks,&local_b9);
  std::pair<unsigned_long,_bool>::pair<bool_&,_true>
            (&pStack_a8,&kFlag_aes_hw_encrypt,&(this->super_ImplDispatchTest).aesni_);
  std::pair<unsigned_long,_bool>::pair<bool_&,_true>
            (&pStack_98,&kFlag_aes_hw_set_encrypt_key,&(this->super_ImplDispatchTest).aesni_);
  local_102 = 0;
  if (((((this->super_ImplDispatchTest).is_x86_64_ & 1U) != 0) &&
      (local_102 = 0, ((this->super_ImplDispatchTest).aesni_ & 1U) != 0)) &&
     (local_102 = 0, ((this->super_ImplDispatchTest).avx_movbe_ & 1U) != 0)) {
    local_102 = (this->super_ImplDispatchTest).vaes_ ^ 0xff;
  }
  local_ba = (bool)(local_102 & 1);
  std::pair<unsigned_long,_bool>::pair<bool,_true>(&pStack_88,&kFlag_aesni_gcm_encrypt,&local_ba);
  local_111 = 0;
  if (((this->super_ImplDispatchTest).ssse3_ & 1U) != 0) {
    local_111 = (this->super_ImplDispatchTest).aesni_ ^ 0xff;
  }
  local_bb = (bool)(local_111 & 1);
  std::pair<unsigned_long,_bool>::pair<bool,_true>(&pStack_78,&kFlag_vpaes_encrypt,&local_bb);
  local_121 = 0;
  if (((this->super_ImplDispatchTest).ssse3_ & 1U) != 0) {
    local_121 = (this->super_ImplDispatchTest).aesni_ ^ 0xff;
  }
  local_bc = (bool)(local_121 & 1);
  std::pair<unsigned_long,_bool>::pair<bool,_true>
            (&pStack_68,&kFlag_vpaes_set_encrypt_key,&local_bc);
  local_131 = 0;
  if ((((this->super_ImplDispatchTest).is_x86_64_ & 1U) != 0) &&
     (local_131 = 0, ((this->super_ImplDispatchTest).vaes_ & 1U) != 0)) {
    local_141 = 0;
    if (((this->super_ImplDispatchTest).avx512_ & 1U) != 0) {
      local_141 = (this->super_ImplDispatchTest).avoid_zmm_ ^ 0xff;
    }
    local_131 = local_141 ^ 0xff;
  }
  local_bd = (bool)(local_131 & 1);
  std::pair<unsigned_long,_bool>::pair<bool,_true>
            (&pStack_58,&kFlag_aes_gcm_enc_update_vaes_avx2,&local_bd);
  local_142 = 0;
  if (((((this->super_ImplDispatchTest).is_x86_64_ & 1U) != 0) &&
      (local_142 = 0, ((this->super_ImplDispatchTest).vaes_ & 1U) != 0)) &&
     (local_142 = 0, ((this->super_ImplDispatchTest).avx512_ & 1U) != 0)) {
    local_142 = (this->super_ImplDispatchTest).avoid_zmm_ ^ 0xff;
  }
  local_be = (bool)(local_142 & 1);
  std::pair<unsigned_long,_bool>::pair<bool,_true>
            (&pStack_48,&kFlag_aes_gcm_enc_update_vaes_avx512,&local_be);
  local_38 = &local_b8;
  local_30 = 8;
  std::allocator<std::pair<unsigned_long,_bool>_>::allocator(&local_bf);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>::
  vector(&local_28,__l,&local_bf);
  std::function<void()>::function<ImplDispatchTest_AEAD_AES_GCM_Test::TestBody()::__0,void>
            ((function<void()> *)&local_f0,&local_f1);
  ImplDispatchTest::AssertFunctionsHit(&this->super_ImplDispatchTest,&local_28,&local_f0);
  std::function<void_()>::~function(&local_f0);
  std::vector<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>::
  ~vector(&local_28);
  std::allocator<std::pair<unsigned_long,_bool>_>::~allocator(&local_bf);
  return;
}

Assistant:

TEST_F(ImplDispatchTest, AEAD_AES_GCM) {
  AssertFunctionsHit(
      {
          {kFlag_aes_hw_ctr32_encrypt_blocks, aesni_ && !(is_x86_64_ && vaes_)},
          {kFlag_aes_hw_encrypt, aesni_},
          {kFlag_aes_hw_set_encrypt_key, aesni_},
          {kFlag_aesni_gcm_encrypt,
           is_x86_64_ && aesni_ && avx_movbe_ && !vaes_},
          {kFlag_vpaes_encrypt, ssse3_ && !aesni_},
          {kFlag_vpaes_set_encrypt_key, ssse3_ && !aesni_},
          {kFlag_aes_gcm_enc_update_vaes_avx2,
           is_x86_64_ && vaes_ && !(avx512_ && !avoid_zmm_)},
          {kFlag_aes_gcm_enc_update_vaes_avx512,
           is_x86_64_ && vaes_ && avx512_ && !avoid_zmm_},
      },
      [] {
        const uint8_t kZeros[16] = {0};
        const uint8_t kPlaintext[40] = {1, 2, 3, 4, 0};
        uint8_t ciphertext[sizeof(kPlaintext) + 16];
        size_t ciphertext_len;
        bssl::ScopedEVP_AEAD_CTX ctx;
        ASSERT_TRUE(EVP_AEAD_CTX_init(ctx.get(), EVP_aead_aes_128_gcm(), kZeros,
                                      sizeof(kZeros),
                                      EVP_AEAD_DEFAULT_TAG_LENGTH, nullptr));
        ASSERT_TRUE(EVP_AEAD_CTX_seal(
            ctx.get(), ciphertext, &ciphertext_len, sizeof(ciphertext), kZeros,
            EVP_AEAD_nonce_length(EVP_aead_aes_128_gcm()), kPlaintext,
            sizeof(kPlaintext), nullptr, 0));
      });
}